

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::make_l2_norm
          (quadratic_cost_type<long_double> *this,int n)

{
  longdouble lVar1;
  int iVar2;
  bool bVar3;
  type plVar4;
  type piVar5;
  type pqVar6;
  int local_3c;
  int e_1;
  int i_3;
  int i_2;
  int e;
  int i_1;
  int i;
  longdouble div;
  int n_local;
  quadratic_cost_type<long_double> *this_local;
  
  _i_1 = (longdouble)0;
  for (e = 0; e != n; e = e + 1) {
    plVar4 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->linear_elements,(long)e);
    lVar1 = *plVar4;
    plVar4 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->linear_elements,(long)e);
    _i_1 = lVar1 * *plVar4 + _i_1;
  }
  i_2 = 0;
  piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n);
  iVar2 = *piVar5;
  for (; i_2 != iVar2; i_2 = i_2 + 1) {
    pqVar6 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_2);
    lVar1 = pqVar6->factor;
    pqVar6 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_2);
    _i_1 = lVar1 * pqVar6->factor + _i_1;
  }
  bVar3 = std::isnormal(_i_1);
  if (bVar3) {
    for (e_1 = 0; e_1 != n; e_1 = e_1 + 1) {
      plVar4 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->linear_elements,(long)e_1);
      *plVar4 = *plVar4 / _i_1;
    }
    local_3c = 0;
    piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n)
    ;
    iVar2 = *piVar5;
    for (; local_3c != iVar2; local_3c = local_3c + 1) {
      pqVar6 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_3c);
      pqVar6->factor = pqVar6->factor / _i_1;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];
        ;

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += quadratic_elements[i].factor * quadratic_elements[i].factor;

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }